

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.hh
# Opt level: O2

void __thiscall kratos::GeneratorConst::~GeneratorConst(GeneratorConst *this)

{
  Const::~Const(&this->super_Const);
  operator_delete(this,0x2a8);
  return;
}

Assistant:

explicit GeneratorConst(const Generator &gen) : Const(0, 1, false), gen_(gen) {}